

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall van_kampen::Node::printSelf(Node *this,ostream *os,graphOutputFormat fmt)

{
  ulong uVar1;
  char *__rhs;
  allocator<char> local_e2;
  byte local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string comment;
  undefined1 local_98 [8];
  string label;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string shape;
  graphOutputFormat fmt_local;
  ostream *os_local;
  Node *this_local;
  
  if (fmt == DOT) {
    shape.field_2._12_4_ = fmt;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"shape=",&local_61);
    __rhs = "point";
    if ((this->isHighlighted_ & 1U) != 0) {
      __rhs = "circle";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,__rhs);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    uVar1 = std::__cxx11::string::empty();
    comment.field_2._M_local_buf[0xe] = '\0';
    if ((uVar1 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     ",label=",&this->label_);
    }
    else {
      std::allocator<char>::allocator();
      comment.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,"",(allocator<char> *)(comment.field_2._M_local_buf + 0xf));
    }
    if ((comment.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(comment.field_2._M_local_buf + 0xf));
    }
    uVar1 = std::__cxx11::string::empty();
    local_e1 = 0;
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_e0,",xlabel=\"",&this->comment_);
      local_e1 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     &local_e0,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"",&local_e2);
      std::allocator<char>::~allocator(&local_e2);
    }
    if ((local_e1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    utility::
    print<int_const&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[4]>
              (os,&this->id_,(char (*) [2])"[",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [4])"];\n");
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void Node::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
    {
        std::string shape = std::string{"shape="} + (isHighlighted_ ? "circle" : "point");
        std::string label = !label_.empty() ? ",label=" + label_ : "";
        std::string comment = !comment_.empty() ? ",xlabel=\"" + comment_ + "\"" : "";
        utility::print(os, id_, "[", shape, label, comment, "];\n");
        break;
    }

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
}